

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ReporterConfig::ReporterConfig(ReporterConfig *this,Ptr<Catch::IConfig> *_fullConfig)

{
  int iVar1;
  IConfig *pIVar2;
  undefined4 extraout_var;
  Ptr<Catch::IConfig> *in_RSI;
  Ptr<Catch::IConfig> *in_RDI;
  
  pIVar2 = Ptr<Catch::IConfig>::operator->(in_RSI);
  iVar1 = (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[5])();
  in_RDI->m_p = (IConfig *)CONCAT44(extraout_var,iVar1);
  Ptr<Catch::IConfig>::Ptr(in_RSI,in_RDI);
  return;
}

Assistant:

explicit ReporterConfig( Ptr<IConfig> const& _fullConfig )
        :   m_stream( &_fullConfig->stream() ), m_fullConfig( _fullConfig ) {}